

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O2

void __thiscall
OpenMD::BondAngleDistribution::writeBondAngleDistribution(BondAngleDistribution *this)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  Revision r;
  string local_248;
  ofstream ofs;
  
  iVar1 = this->nTotBonds_;
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out)
  ;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::operator+(&local_248,&(this->super_StaticAnalyser).outputFilename_,"q");
    snprintf(painCave.errMsg,2000,"BondAngleDistribution: unable to open %s\n",
             local_248._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_248);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_248,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_248);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_248,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_248);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar3 = std::operator<<((ostream *)&ofs,"# selection script: \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->selectionScript_);
    std::operator<<(poVar3,"\"\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar3,"\n");
    }
    for (lVar4 = 0; lVar4 < this->nBins_; lVar4 = lVar4 + 1) {
      std::ostream::_M_insert<double>((double)(int)lVar4 * this->deltaTheta_);
      std::operator<<((ostream *)&ofs,"\t");
      std::ostream::_M_insert<double>
                (((double)(this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4] /
                 (((double)iVar1 + -1.0) * (double)iVar1 * 0.5)) / (double)this->frameCounter_);
      std::operator<<((ostream *)&ofs,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void BondAngleDistribution::writeBondAngleDistribution() {
    RealType norm = (RealType)nTotBonds_ * ((RealType)nTotBonds_ - 1.0) / 2.0;

    std::ofstream ofs(getOutputFileName().c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Thetaval = i * deltaTheta_;
        ofs << Thetaval;
        ofs << "\t" << (RealType)histogram_[i] / norm / frameCounter_;
        ofs << "\n";
      }

      ofs.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondAngleDistribution: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }